

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.hpp
# Opt level: O2

double __thiscall
gl4cts::ShaderSubroutine::Utils::vec4<unsigned_int>::log(vec4<unsigned_int> *this,double __x)

{
  MessageBuilder *pMVar1;
  MessageBuilder *in_RSI;
  double extraout_XMM0_Qa;
  
  std::operator<<(&(in_RSI->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"[ ");
  pMVar1 = tcu::MessageBuilder::operator<<(in_RSI,&this->m_x);
  std::operator<<(&(pMVar1->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_y);
  std::operator<<(&(pMVar1->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_z);
  std::operator<<(&(pMVar1->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_w);
  std::operator<<(&(pMVar1->m_str).super_basic_ostream<char,_std::char_traits<char>_>," ]");
  return extraout_XMM0_Qa;
}

Assistant:

void log(tcu::MessageBuilder& message) const
		{
			message << "[ " << m_x << ", " << m_y << ", " << m_z << ", " << m_w << " ]";
		}